

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message1_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message2_fields,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  SpecificField *pSVar6;
  ulong uVar7;
  undefined7 extraout_var_00;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  Metadata MVar13;
  iterator iVar14;
  FieldDescriptor *local_98;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_90;
  undefined4 local_84;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_80;
  FieldDescriptor *local_78;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *local_70;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_58;
  Reflection *local_40;
  Reflection *local_38;
  undefined7 extraout_var;
  
  MVar13 = Message::GetMetadata(message1);
  local_38 = MVar13.reflection;
  MVar13 = Message::GetMetadata(message2);
  local_40 = MVar13.reflection;
  local_98 = *(message1_fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_78 = *(message2_fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  bVar11 = local_98 == (FieldDescriptor *)0x0;
  bVar12 = local_78 == (FieldDescriptor *)0x0;
  bVar2 = 1;
  if (!bVar11 || !bVar12) {
    local_70 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&this->force_compare_no_presence_fields_;
    local_60 = &this->force_compare_failure_triggering_fields_;
    local_84 = 0;
    iVar9 = 0;
    iVar8 = 0;
    local_90 = message1_fields;
    local_80 = message2_fields;
    do {
      if (bVar11) {
        if (bVar12) {
LAB_003134ba:
          bVar11 = IsIgnored(this,message1,message2,local_98,parent_fields);
          if (!bVar11) {
            if (local_98 == (FieldDescriptor *)0x0) {
              __assert_fail("field1 != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                            ,0x3d5,
                            "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                           );
            }
            if ((local_98->type_ == '\v') &&
               (bVar11 = FieldDescriptor::is_map_message_type(local_98), bVar11)) {
              bVar11 = CompareMapField(this,message1,message2,unpacked_any,local_98,parent_fields);
              uVar7 = CONCAT71(extraout_var,bVar11);
LAB_00313946:
              if ((char)uVar7 == '\0') {
LAB_00313aaf:
                local_84 = (undefined4)CONCAT71((int7)(uVar7 >> 8),1);
                if (this->reporter_ == (Reporter *)0x0) goto LAB_00313b02;
              }
            }
            else {
              bVar2 = local_98->field_0x1;
              if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) goto LAB_00313b6b;
              if ((bVar2 & 0x20) != 0) {
                bVar11 = CompareRepeatedField
                                   (this,message1,message2,unpacked_any,local_98,parent_fields);
                uVar7 = CONCAT71(extraout_var_00,bVar11);
                goto LAB_00313946;
              }
              bVar11 = CompareFieldValueUsingParentFields
                                 (this,message1,message2,unpacked_any,local_98,-1,-1,parent_fields);
              iVar14 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                       ::find<google::protobuf::FieldDescriptor_const*>(local_70,&local_98);
              if (iVar14.ctrl_ != (ctrl_t *)0x0) {
                local_68 = local_60;
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                ::EmplaceDecomposable::operator()
                          (&local_58,&local_68,local_98->all_names_ + 1,local_98->all_names_ + 1);
              }
              if (this->reporter_ == (Reporter *)0x0) {
                message2_fields = local_80;
                if (!bVar11) goto LAB_00313b02;
              }
              else {
                pSVar6 = PushSpecificField(parent_fields);
                pSVar6->message1 = message1;
                pSVar6->message2 = message2;
                pSVar6->unpacked_any = unpacked_any;
                pSVar6->field = local_98;
                if (this->force_compare_no_presence_ == true) {
                  iVar14 = absl::lts_20240722::container_internal::
                           raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                           ::find<google::protobuf::FieldDescriptor_const*>(local_70,&local_98);
                  bVar12 = iVar14.ctrl_ != (ctrl_t *)0x0;
                }
                else {
                  bVar12 = false;
                }
                message2_fields = local_80;
                pSVar6->forced_compare_no_presence_ = bVar12;
                if (!bVar11) {
                  uVar5 = (*this->reporter_->_vptr_Reporter[4])
                                    (this->reporter_,message1,message2,parent_fields);
                  uVar7 = (ulong)uVar5;
                  ppSVar1 = &(parent_fields->
                             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppSVar1 = *ppSVar1 + -1;
                  message2_fields = local_80;
                  goto LAB_00313aaf;
                }
                if (this->report_matches_ == true) {
                  (*this->reporter_->_vptr_Reporter[6])
                            (this->reporter_,message1,message2,parent_fields);
                }
                ppSVar1 = &(parent_fields->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + -1;
              }
            }
            iVar9 = iVar9 + 1;
            iVar8 = iVar8 + 1;
            goto LAB_00313ac0;
          }
          if (this->reporter_ != (Reporter *)0x0) {
            pSVar6 = PushSpecificField(parent_fields);
            pSVar6->message1 = message1;
            pSVar6->message2 = message2;
            pSVar6->unpacked_any = unpacked_any;
            pSVar6->field = local_98;
            if (this->report_ignores_ == true) {
              (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields)
              ;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
            message2_fields = local_80;
          }
          iVar9 = iVar9 + 1;
        }
        else {
LAB_00313724:
          bVar11 = IsIgnored(this,message1,message2,local_78,parent_fields);
          if (!bVar11) {
            iVar14 = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                     ::find<google::protobuf::FieldDescriptor_const*>(local_70,&local_78);
            if (iVar14.ctrl_ != (ctrl_t *)0x0) {
              local_68 = local_60;
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              ::EmplaceDecomposable::operator()
                        (&local_58,&local_68,local_78->all_names_ + 1,local_78->all_names_ + 1);
            }
            if (this->reporter_ == (Reporter *)0x0) goto LAB_00313b02;
            bVar2 = local_78->field_0x1;
            if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) goto LAB_00313b56;
            iVar3 = 1;
            if (((bVar2 & 0x20) == 0) ||
               (iVar3 = Reflection::FieldSize(local_40,message2,local_78), iVar4 = iVar3, 0 < iVar3)
               ) {
              iVar10 = 0;
              do {
                pSVar6 = PushSpecificField(parent_fields);
                pSVar6->message1 = message1;
                pSVar6->message2 = message2;
                pSVar6->unpacked_any = unpacked_any;
                pSVar6->field = local_78;
                bVar2 = local_78->field_0x1;
                if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) goto LAB_00313b2c;
                if ((bVar2 & 0x20) == 0) {
                  pSVar6->index = -1;
                  pSVar6->new_index = -1;
                }
                else {
                  pSVar6->index = iVar10;
                  AddSpecificNewIndex(pSVar6,message2,local_78,iVar10);
                }
                if (this->force_compare_no_presence_ == true) {
                  iVar14 = absl::lts_20240722::container_internal::
                           raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                           ::find<google::protobuf::FieldDescriptor_const*>(local_70,&pSVar6->field)
                  ;
                  bVar11 = iVar14.ctrl_ != (ctrl_t *)0x0;
                }
                else {
                  bVar11 = false;
                }
                pSVar6->forced_compare_no_presence_ = bVar11;
                iVar4 = (*this->reporter_->_vptr_Reporter[2])
                                  (this->reporter_,message1,message2,parent_fields);
                ppSVar1 = &(parent_fields->
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppSVar1 = *ppSVar1 + -1;
                iVar10 = iVar10 + 1;
              } while (iVar3 != iVar10);
            }
            iVar8 = iVar8 + 1;
            local_84 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
            message2_fields = local_80;
            goto LAB_00313ac0;
          }
          if (this->reporter_ != (Reporter *)0x0) {
            pSVar6 = PushSpecificField(parent_fields);
            pSVar6->message1 = message1;
            pSVar6->message2 = message2;
            pSVar6->unpacked_any = unpacked_any;
            pSVar6->field = local_78;
            if (this->report_ignores_ == true) {
              (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields)
              ;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
            message2_fields = local_80;
          }
        }
        iVar8 = iVar8 + 1;
      }
      else {
        if (!bVar12) {
          if (local_78->number_ <= local_98->number_) {
            if (local_78->number_ < local_98->number_) goto LAB_00313724;
            goto LAB_003134ba;
          }
        }
        bVar11 = IsIgnored(this,message1,message2,local_98,parent_fields);
        if (bVar11) {
          if (this->reporter_ != (Reporter *)0x0) {
            pSVar6 = PushSpecificField(parent_fields);
            pSVar6->message1 = message1;
            pSVar6->message2 = message2;
            pSVar6->unpacked_any = unpacked_any;
            pSVar6->field = local_98;
            if (this->report_ignores_ == true) {
              (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields)
              ;
            }
            ppSVar1 = &(parent_fields->
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + -1;
            message2_fields = local_80;
          }
          iVar9 = iVar9 + 1;
        }
        else {
          if (this->reporter_ == (Reporter *)0x0) {
LAB_00313b02:
            bVar2 = 0;
            goto LAB_00313b04;
          }
          if (local_98 == (FieldDescriptor *)0x0) goto LAB_00313b80;
          bVar2 = local_98->field_0x1;
          if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
LAB_00313b41:
            CompareWithFieldsInternal();
LAB_00313b56:
            CompareWithFieldsInternal();
LAB_00313b6b:
            CompareWithFieldsInternal();
LAB_00313b80:
            __assert_fail("field1 != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                          ,0x365,
                          "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                         );
          }
          iVar3 = 1;
          if (((bVar2 & 0x20) == 0) ||
             (iVar3 = Reflection::FieldSize(local_38,message1,local_98), iVar4 = iVar3, 0 < iVar3))
          {
            iVar10 = 0;
LAB_00313632:
            pSVar6 = PushSpecificField(parent_fields);
            pSVar6->message1 = message1;
            pSVar6->message2 = message2;
            pSVar6->unpacked_any = unpacked_any;
            pSVar6->field = local_98;
            bVar2 = local_98->field_0x1;
            if (0xbf < bVar2 == (bool)((bVar2 & 0x20) >> 5)) goto code_r0x0031366e;
            CompareWithFieldsInternal();
LAB_00313b2c:
            CompareWithFieldsInternal();
            goto LAB_00313b41;
          }
LAB_003136b2:
          iVar9 = iVar9 + 1;
          local_84 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
          message2_fields = local_80;
        }
      }
LAB_00313ac0:
      local_98 = (local_90->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[iVar9];
      local_78 = (message2_fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[iVar8];
      bVar11 = local_98 == (FieldDescriptor *)0x0;
      bVar12 = local_78 == (FieldDescriptor *)0x0;
    } while (!bVar11 || !bVar12);
    bVar2 = (byte)local_84 ^ 1;
  }
LAB_00313b04:
  return (bool)(bVar2 & 1);
code_r0x0031366e:
  if ((bVar2 & 0x20) == 0) {
    pSVar6->index = -1;
  }
  else {
    AddSpecificIndex(pSVar6,message1,local_98,iVar10);
  }
  iVar4 = (*this->reporter_->_vptr_Reporter[3])(this->reporter_,message1,message2,parent_fields);
  ppSVar1 = &(parent_fields->
             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  iVar10 = iVar10 + 1;
  if (iVar3 == iVar10) goto LAB_003136b2;
  goto LAB_00313632;
}

Assistant:

bool MessageDifferencer::CompareWithFieldsInternal(
    const Message& message1, const Message& message2, int unpacked_any,
    const std::vector<const FieldDescriptor*>& message1_fields,
    const std::vector<const FieldDescriptor*>& message2_fields,
    std::vector<SpecificField>* parent_fields) {
  bool isDifferent = false;
  int field_index1 = 0;
  int field_index2 = 0;

  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  while (true) {
    const FieldDescriptor* field1 = message1_fields[field_index1];
    const FieldDescriptor* field2 = message2_fields[field_index2];

    // Once we have reached sentinel values, we are done the comparison.
    if (field1 == NULL && field2 == NULL) {
      break;
    }

    // Check for differences in the field itself.
    if (FieldBefore(field1, field2)) {
      // Field 1 is not in the field list for message 2.
      if (IsIgnored(message1, message2, field1, *parent_fields)) {
        // We are ignoring field1. Report the ignore and move on to
        // the next field in message1_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index1;
        continue;
      }

      if (reporter_ != NULL) {
        assert(field1 != NULL);
        int count = field1->is_repeated()
                        ? reflection1->FieldSize(message1, field1)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (field1->is_repeated()) {
            AddSpecificIndex(&specific_field, message1, field1, i);
          } else {
            specific_field.index = -1;
          }

          reporter_->ReportDeleted(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index1;
      continue;
    } else if (FieldBefore(field2, field1)) {
      const bool ignore_field =
          IsIgnored(message1, message2, field2, *parent_fields);
      if (!ignore_field && force_compare_no_presence_fields_.contains(field2)) {
        force_compare_failure_triggering_fields_.emplace(field2->full_name());
      }

      // Field 2 is not in the field list for message 1.
      if (ignore_field) {
        // We are ignoring field2. Report the ignore and move on to
        // the next field in message2_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index2;
        continue;
      }

      if (reporter_ != NULL) {
        int count = field2->is_repeated()
                        ? reflection2->FieldSize(message2, field2)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1,
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (field2->is_repeated()) {
            specific_field.index = i;
            AddSpecificNewIndex(&specific_field, message2, field2, i);
          } else {
            specific_field.index = -1;
            specific_field.new_index = -1;
          }

          specific_field.forced_compare_no_presence_ =
              force_compare_no_presence_ &&
              force_compare_no_presence_fields_.contains(specific_field.field);

          reporter_->ReportAdded(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index2;
      continue;
    }

    // By this point, field1 and field2 are guaranteed to point to the same
    // field, so we can now compare the values.
    if (IsIgnored(message1, message2, field1, *parent_fields)) {
      // Ignore this field. Report and move on.
      if (reporter_ != NULL) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        if (report_ignores_) {
          reporter_->ReportIgnored(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }

      ++field_index1;
      ++field_index2;
      continue;
    }

    bool fieldDifferent = false;
    assert(field1 != NULL);
    if (field1->is_map()) {
      fieldDifferent = !CompareMapField(message1, message2, unpacked_any,
                                        field1, parent_fields);
    } else if (field1->is_repeated()) {
      fieldDifferent = !CompareRepeatedField(message1, message2, unpacked_any,
                                             field1, parent_fields);
    } else {
      fieldDifferent = !CompareFieldValueUsingParentFields(
          message1, message2, unpacked_any, field1, -1, -1, parent_fields);

      if (force_compare_no_presence_fields_.contains(field1)) {
        force_compare_failure_triggering_fields_.emplace(field1->full_name());
      }

      if (reporter_ != nullptr) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        specific_field.forced_compare_no_presence_ =
            force_compare_no_presence_ &&
            force_compare_no_presence_fields_.contains(field1);

        if (fieldDifferent) {
          reporter_->ReportModified(message1, message2, *parent_fields);
          isDifferent = true;
        } else if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }
    }
    if (fieldDifferent) {
      if (reporter_ == nullptr) return false;
      isDifferent = true;
    }
    // Increment the field indices.
    ++field_index1;
    ++field_index2;
  }

  return !isDifferent;
}